

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

ssize_t http_decode_path(char *dest,char *url_data,size_t length)

{
  int iVar1;
  long lVar2;
  uint8_t *puVar3;
  uint8_t *source;
  
  lVar2 = 0;
  puVar3 = (uint8_t *)url_data;
  do {
    if (url_data + length <= puVar3) {
      dest[lVar2] = '\0';
      return lVar2;
    }
    source = puVar3 + 1;
    if (*puVar3 == '%') {
      iVar1 = hex2byte((uint8_t *)(dest + lVar2),source);
      if (iVar1 != 0) {
        return -1;
      }
      source = puVar3 + 3;
    }
    else {
      dest[lVar2] = *puVar3;
    }
    lVar2 = lVar2 + 1;
    puVar3 = source;
  } while( true );
}

Assistant:

ssize_t http_decode_path(char *dest, const char *url_data, size_t length) {
  char *pos = dest;
  const char *end = url_data + length;
  while (url_data < end) {
    if (*url_data == '%') {
      // decode hex value
      // this is a percent encoded value.
      if (hex2byte((uint8_t *)pos, (uint8_t *)&url_data[1]))
        return -1;
      pos++;
      url_data += 3;
    } else
      *(pos++) = *(url_data++);
  }
  *pos = 0;
  return pos - dest;
}